

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

int __thiscall llvm::yaml::Scanner::init(Scanner *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  MemoryBufferRef Ref;
  int extraout_EAX;
  int iVar2;
  char *in_stack_00000008;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  size_t in_stack_00000020;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> InputBufferOwner;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_30;
  SrcBuffer local_28;
  
  (this->InputBuffer).Buffer.Data = in_stack_00000008;
  (this->InputBuffer).Buffer.Length = in_stack_00000010;
  (this->InputBuffer).Identifier.Data = in_stack_00000018;
  (this->InputBuffer).Identifier.Length = in_stack_00000020;
  pcVar1 = (this->InputBuffer).Buffer.Data;
  this->Current = pcVar1;
  this->End = pcVar1 + (this->InputBuffer).Buffer.Length;
  this->Indent = -1;
  this->Column = 0;
  this->Line = 0;
  this->FlowLevel = 0;
  this->IsStartOfStream = true;
  this->IsSimpleKeyAllowed = true;
  this->Failed = false;
  Ref.Buffer.Length = in_stack_00000010;
  Ref.Buffer.Data = in_stack_00000008;
  Ref.Identifier.Data = in_stack_00000018;
  Ref.Identifier.Length = in_stack_00000020;
  MemoryBuffer::getMemBuffer(Ref,SUB81(&local_30,0));
  local_28.Buffer._M_t.
  super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       local_30._M_head_impl;
  local_30._M_head_impl = (MemoryBuffer *)0x0;
  local_28.OffsetCache.Val.Val.Value = (ValTy)(ValTy)0x0;
  local_28.IncludeLoc.Ptr = (char *)0x0;
  std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::
  emplace_back<llvm::SourceMgr::SrcBuffer>(&this->SM->Buffers,&local_28);
  SourceMgr::SrcBuffer::~SrcBuffer(&local_28);
  iVar2 = extraout_EAX;
  if (local_30._M_head_impl != (MemoryBuffer *)0x0) {
    iVar2 = (*(local_30._M_head_impl)->_vptr_MemoryBuffer[1])();
  }
  return iVar2;
}

Assistant:

void Scanner::init(MemoryBufferRef Buffer) {
  InputBuffer = Buffer;
  Current = InputBuffer.getBufferStart();
  End = InputBuffer.getBufferEnd();
  Indent = -1;
  Column = 0;
  Line = 0;
  FlowLevel = 0;
  IsStartOfStream = true;
  IsSimpleKeyAllowed = true;
  Failed = false;
  std::unique_ptr<MemoryBuffer> InputBufferOwner =
      MemoryBuffer::getMemBuffer(Buffer);
  SM.AddNewSourceBuffer(std::move(InputBufferOwner), SMLoc());
}